

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backoff.c
# Opt level: O0

void nn_backoff_start(nn_backoff *self)

{
  int iVar1;
  long in_RDI;
  int timeout;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = (*(int *)(in_RDI + 0xf0) + -1) * *(int *)(in_RDI + 0xe8);
  if (*(int *)(in_RDI + 0xec) < iVar1) {
    iVar1 = *(int *)(in_RDI + 0xec);
  }
  else {
    *(int *)(in_RDI + 0xf0) = *(int *)(in_RDI + 0xf0) << 1;
  }
  nn_timer_start((nn_timer *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void nn_backoff_start (struct nn_backoff *self)
{
     int timeout;

     /*  Start the timer for the actual n value. If the interval haven't yet
         exceeded the maximum, double the next timeout value. */
     timeout = (self->n - 1) * self->minivl;
     if (timeout > self->maxivl)
         timeout = self->maxivl;
     else
         self->n *= 2;
     nn_timer_start (&self->timer, timeout);
}